

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdditionGeneralizationImpl.hpp
# Opt level: O3

void __thiscall
Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>::
MonomSet(MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,Variable var,
        Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
        *poly)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **ppMVar1;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *r;
  InnerType *r_00;
  long lVar2;
  ulong uVar3;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar4;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_98;
  uint local_68;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_60;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_58;
  
  local_58._cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_58._end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_58._capacity = 0;
  local_58._stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            (&this->_cancellable,&local_58);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack(&local_58);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::reserve
            (&this->_cancellable,
             (ulong)((int)((ulong)((long)(poly->_ptr->_summands)._cursor -
                                  (long)(poly->_ptr->_summands)._stack) >> 4) * -0x55555555 - 1));
  local_98.numeral._num._val[0]._mp_d = (mp_limb_t *)poly->_ptr;
  pMVar4 = (((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
            local_98.numeral._num._val[0]._mp_d)->_summands)._stack;
  lVar2 = (long)(((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 local_98.numeral._num._val[0]._mp_d)->_summands)._cursor - (long)pMVar4;
  if (pMVar4 != (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0 && lVar2 != 0) {
    r = &local_98.factors;
    r_00 = &local_98.numeral._den;
    uVar3 = 1;
    while( true ) {
      Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::tryVar(&local_98);
      if (((char)local_98.numeral._num._val[0]._mp_alloc == '\0') ||
         (local_98.numeral._num._val[0]._mp_size != var._num)) {
        Kernel::IntegerConstantType::IntegerConstantType(r_00,(IntegerConstantType *)pMVar4);
        Kernel::IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)r,&(pMVar4->numeral)._den);
        local_68 = (pMVar4->factors)._id;
        local_60 = (pMVar4->factors)._ptr;
        pMVar4 = (this->_cancellable)._cursor;
        if (pMVar4 == (this->_cancellable)._end) {
          Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                    (&this->_cancellable);
          pMVar4 = (this->_cancellable)._cursor;
        }
        Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)pMVar4,r_00);
        Kernel::IntegerConstantType::IntegerConstantType
                  (&(pMVar4->numeral)._den,(IntegerConstantType *)r);
        (pMVar4->factors)._id = local_68;
        (pMVar4->factors)._ptr = local_60;
        ppMVar1 = &(this->_cancellable)._cursor;
        *ppMVar1 = *ppMVar1 + 1;
        mpz_clear((__mpz_struct *)r);
        mpz_clear(r_00->_val);
      }
      if ((ulong)((lVar2 >> 4) * -0x5555555555555555) <= uVar3) break;
      pMVar4 = ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
               local_98.numeral._num._val[0]._mp_d)->_stack + uVar3;
      uVar3 = uVar3 + 1;
    }
  }
  return;
}

Assistant:

MonomSet(Variable var, Perfect<Polynom<NumTraits>> poly) : MonomSet(decltype(_cancellable)()) 
  {
    _cancellable.reserve(poly->nSummands() - 1);
    for (auto const& monom : poly->iterSummands()) {
      if (monom.tryVar() != some(var)) {
        _cancellable.push(monom);
      }
    }
  }